

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O3

void render_html_escaped(MD_HTML *r,MD_CHAR *data,MD_SIZE size)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  void *pvVar6;
  MD_SIZE MVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  
  uVar3 = (ulong)size;
  uVar10 = 0;
  do {
    uVar5 = (ulong)uVar10;
    if (uVar10 + 3 < size) {
      uVar5 = (ulong)uVar10;
      while (((iVar4 = (int)uVar5, (r->escape_map[(byte)data[uVar5]] & 1U) == 0 &&
              ((r->escape_map[(byte)data[iVar4 + 1]] & 1U) == 0)) &&
             ((r->escape_map[(byte)data[iVar4 + 2]] & 1U) == 0))) {
        if (((r->escape_map[(byte)data[iVar4 + 3]] & 1U) != 0) ||
           (uVar5 = (ulong)(iVar4 + 4), size <= iVar4 + 7U)) break;
      }
    }
    if ((uint)uVar5 < size) {
      bVar11 = true;
      if ((r->escape_map[(byte)data[uVar5]] & 1U) == 0) {
        do {
          if (uVar3 - 1 == uVar5) {
            bVar11 = false;
            uVar5 = uVar3;
            goto LAB_0010db5d;
          }
          lVar2 = uVar5 + 1;
          uVar5 = uVar5 + 1;
        } while ((r->escape_map[(byte)data[lVar2]] & 1U) == 0);
        bVar11 = uVar5 < uVar3;
LAB_0010db5d:
        uVar5 = uVar5 & 0xffffffff;
      }
    }
    else {
      bVar11 = false;
    }
    uVar9 = (uint)uVar5;
    if (uVar10 <= uVar9 && uVar9 - uVar10 != 0) {
      (*r->process_output)(data + uVar10,uVar9 - uVar10,r->userdata);
    }
    if (!bVar11) {
      return;
    }
    bVar1 = data[uVar5];
    if (bVar1 < 0x3c) {
      if (bVar1 == 0x22) {
        pvVar6 = r->userdata;
        pcVar8 = "&quot;";
        MVar7 = 6;
        goto LAB_0010dbda;
      }
      if (bVar1 == 0x26) {
        pvVar6 = r->userdata;
        pcVar8 = "&amp;";
        MVar7 = 5;
        goto LAB_0010dbda;
      }
    }
    else {
      if (bVar1 == 0x3c) {
        pvVar6 = r->userdata;
        pcVar8 = "&lt;";
      }
      else {
        if (bVar1 != 0x3e) goto LAB_0010dbdd;
        pvVar6 = r->userdata;
        pcVar8 = "&gt;";
      }
      MVar7 = 4;
LAB_0010dbda:
      (*r->process_output)(pcVar8,MVar7,pvVar6);
    }
LAB_0010dbdd:
    uVar10 = uVar9 + 1;
  } while( true );
}

Assistant:

static void
render_html_escaped(MD_HTML* r, const MD_CHAR* data, MD_SIZE size)
{
    MD_OFFSET beg = 0;
    MD_OFFSET off = 0;

    /* Some characters need to be escaped in normal HTML text. */
    #define NEED_HTML_ESC(ch)   (r->escape_map[(unsigned char)(ch)] & NEED_HTML_ESC_FLAG)

    while(1) {
        /* Optimization: Use some loop unrolling. */
        while(off + 3 < size  &&  !NEED_HTML_ESC(data[off+0])  &&  !NEED_HTML_ESC(data[off+1])
                              &&  !NEED_HTML_ESC(data[off+2])  &&  !NEED_HTML_ESC(data[off+3]))
            off += 4;
        while(off < size  &&  !NEED_HTML_ESC(data[off]))
            off++;

        if(off > beg)
            render_verbatim(r, data + beg, off - beg);

        if(off < size) {
            switch(data[off]) {
                case '&':   RENDER_VERBATIM(r, "&amp;"); break;
                case '<':   RENDER_VERBATIM(r, "&lt;"); break;
                case '>':   RENDER_VERBATIM(r, "&gt;"); break;
                case '"':   RENDER_VERBATIM(r, "&quot;"); break;
            }
            off++;
        } else {
            break;
        }
        beg = off;
    }
}